

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_inline_array(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  int32_t b;
  int32_t a;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo","[",uVar2,0xf,1,uVar2,CONCAT44(uVar5,0xf),CONCAT44(uVar6,2),"]",0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo","[",uVar3,0xf,&a,uVar3,0xf,&b,"]",0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", \"[\", BCONE_INT32 (a), BCONE_INT32 (b), \"]\")";
    uVar2 = 0x154;
  }
  else if (a == 1) {
    if (b == 2) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "b == 2";
    uVar2 = 0x157;
  }
  else {
    pcVar4 = "a == 1";
    uVar2 = 0x156;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar2,"test_inline_array",pcVar4);
  abort();
}

Assistant:

static void
test_inline_array (void)
{
   bson_t bcon, expected, child;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);

   bson_append_utf8 (&child, "0", -1, "baz", -1);
   bson_append_array (&expected, "foo", -1, &child);

   BCON_APPEND (&bcon, "foo", "[", "baz", "]");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&child);
   bson_destroy (&expected);
}